

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void cm_zlib__tr_align(deflate_state *s)

{
  Bytef BVar1;
  uint uVar2;
  int iVar3;
  ushort uVar4;
  uint uVar5;
  
  iVar3 = s->bi_valid;
  uVar4 = (ushort)(2 << ((byte)iVar3 & 0x1f)) | s->bi_buf;
  uVar5 = (uint)uVar4;
  s->bi_buf = uVar4;
  if (iVar3 < 0xe) {
    iVar3 = iVar3 + 3;
  }
  else {
    uVar5 = s->pending;
    s->pending = uVar5 + 1;
    s->pending_buf[uVar5] = (Bytef)uVar4;
    BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar5 = s->pending;
    s->pending = uVar5 + 1;
    s->pending_buf[uVar5] = BVar1;
    uVar5 = 2 >> (0x10U - (char)s->bi_valid & 0x1f);
    s->bi_buf = (ush)uVar5;
    iVar3 = s->bi_valid + -0xd;
  }
  s->bi_valid = iVar3;
  if (iVar3 < 10) {
    iVar3 = iVar3 + 7;
  }
  else {
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)uVar5;
    BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar5 = s->pending;
    s->pending = uVar5 + 1;
    s->pending_buf[uVar5] = BVar1;
    s->bi_buf = 0;
    iVar3 = s->bi_valid + -9;
  }
  s->bi_valid = iVar3;
  bi_flush(s);
  iVar3 = s->bi_valid;
  if ((s->last_eob_len - iVar3) + 0xb < 9) {
    uVar4 = (ushort)(2 << ((byte)iVar3 & 0x1f)) | s->bi_buf;
    uVar5 = (uint)uVar4;
    s->bi_buf = uVar4;
    if (iVar3 < 0xe) {
      iVar3 = iVar3 + 3;
    }
    else {
      uVar5 = s->pending;
      s->pending = uVar5 + 1;
      s->pending_buf[uVar5] = (Bytef)uVar4;
      BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
      uVar5 = s->pending;
      s->pending = uVar5 + 1;
      s->pending_buf[uVar5] = BVar1;
      uVar5 = 2 >> (0x10U - (char)s->bi_valid & 0x1f);
      s->bi_buf = (ush)uVar5;
      iVar3 = s->bi_valid + -0xd;
    }
    s->bi_valid = iVar3;
    if (iVar3 < 10) {
      iVar3 = iVar3 + 7;
    }
    else {
      uVar2 = s->pending;
      s->pending = uVar2 + 1;
      s->pending_buf[uVar2] = (Bytef)uVar5;
      BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
      uVar5 = s->pending;
      s->pending = uVar5 + 1;
      s->pending_buf[uVar5] = BVar1;
      s->bi_buf = 0;
      iVar3 = s->bi_valid + -9;
    }
    s->bi_valid = iVar3;
    bi_flush(s);
  }
  s->last_eob_len = 7;
  return;
}

Assistant:

void _tr_align(s)
    deflate_state *s;
{
    send_bits(s, STATIC_TREES<<1, 3);
    send_code(s, END_BLOCK, static_ltree);
#ifdef DEBUG
    s->compressed_len += 10L; /* 3 for block type, 7 for EOB */
#endif
    bi_flush(s);
    /* Of the 10 bits for the empty block, we have already sent
     * (10 - bi_valid) bits. The lookahead for the last real code (before
     * the EOB of the previous block) was thus at least one plus the length
     * of the EOB plus what we have just sent of the empty static block.
     */
    if (1 + s->last_eob_len + 10 - s->bi_valid < 9) {
        send_bits(s, STATIC_TREES<<1, 3);
        send_code(s, END_BLOCK, static_ltree);
#ifdef DEBUG
        s->compressed_len += 10L;
#endif
        bi_flush(s);
    }
    s->last_eob_len = 7;
}